

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBorderClampParameterTextureBorderColor.cpp
# Opt level: O3

bool __thiscall
glcts::TextureBorderClampParameterTextureBorderColor::verifyGLGetTexParameterfvResult
          (TextureBorderClampParameterTextureBorderColor *this,GLenum target,GLfloat *expected_data)

{
  int iVar1;
  deUint32 err;
  float *pfVar2;
  undefined4 extraout_var;
  ulong uVar3;
  ostream *poVar4;
  char *__s;
  size_t sVar5;
  value_type_conflict2 *__val;
  GLuint j;
  long lVar6;
  bool bVar7;
  float fVar8;
  float fVar9;
  stringstream returnedDataStream;
  stringstream expectedDataStream;
  long *local_500;
  long local_4f8;
  long local_4f0 [2];
  long *local_4e0;
  long local_4d8;
  long local_4d0 [2];
  undefined1 local_4c0 [8];
  _func_int **local_4b8;
  ios_base local_448 [264];
  stringstream local_340 [128];
  ios_base aiStack_2c0 [264];
  stringstream local_1b8 [128];
  ios_base aiStack_138 [264];
  
  pfVar2 = (float *)operator_new(0x10);
  pfVar2[0] = 0.0;
  pfVar2[1] = 0.0;
  pfVar2[2] = 0.0;
  pfVar2[3] = 0.0;
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__cxx11::stringstream::stringstream(local_340);
  iVar1 = (*((this->super_TextureBorderClampBase).super_TestCaseBase.m_context)->m_renderCtx->
            _vptr_RenderContext[3])();
  pfVar2[0] = 0.0;
  pfVar2[1] = 0.0;
  pfVar2[2] = 0.0;
  pfVar2[3] = 0.0;
  (**(code **)(CONCAT44(extraout_var,iVar1) + 0xac8))
            (target,(this->super_TextureBorderClampBase).super_TestCaseBase.m_glExtTokens.
                    TEXTURE_BORDER_COLOR,pfVar2);
  err = (**(code **)(CONCAT44(extraout_var,iVar1) + 0x800))();
  glu::checkError(err,"Error getting parameter for texture.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/texture_border_clamp/esextcTextureBorderClampParameterTextureBorderColor.cpp"
                  ,0x256);
  fVar8 = *expected_data - *pfVar2;
  fVar9 = -fVar8;
  if (-fVar8 <= fVar8) {
    fVar9 = fVar8;
  }
  if (fVar9 <= 0.0001) {
    uVar3 = 0xffffffffffffffff;
    do {
      if (uVar3 == 2) {
        bVar7 = true;
        goto LAB_00d519bb;
      }
      fVar8 = expected_data[uVar3 + 2] - pfVar2[uVar3 + 2];
      fVar9 = -fVar8;
      if (-fVar8 <= fVar8) {
        fVar9 = fVar8;
      }
      uVar3 = uVar3 + 1;
    } while (fVar9 <= 0.0001);
    bVar7 = 2 < uVar3;
  }
  else {
    bVar7 = false;
  }
  lVar6 = 0;
  do {
    poVar4 = std::ostream::_M_insert<double>((double)expected_data[lVar6]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
    poVar4 = std::ostream::_M_insert<double>((double)pfVar2[lVar6]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  local_4c0 = (undefined1  [8])
              ((this->super_TextureBorderClampBase).super_TestCaseBase.super_TestCase.super_TestNode
              .m_testCtx)->m_log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_4b8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4b8,
             "Wrong value encountered when calling glGetTexParameterfv() with GL_TEXTURE_BORDER_COLOR_EXT pname;"
             ,0x62);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8," texture target:",0x10);
  __s = TextureBorderClampBase::getTexTargetString(&this->super_TextureBorderClampBase,target);
  if (__s == (char *)0x0) {
    std::ios::clear((int)(ostringstream *)&local_4b8 + (int)local_4b8[-3]);
  }
  else {
    sVar5 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,__s,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4b8," expected values:[",0x12);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4b8,(char *)local_4e0,local_4d8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"]",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8," result values:[",0x10);
  std::__cxx11::stringbuf::str();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_4b8,(char *)local_500,local_4f8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_4b8,"]\n",2);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_4c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  if (local_500 != local_4f0) {
    operator_delete(local_500,local_4f0[0] + 1);
  }
  if (local_4e0 != local_4d0) {
    operator_delete(local_4e0,local_4d0[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_4b8);
  std::ios_base::~ios_base(local_448);
LAB_00d519bb:
  std::__cxx11::stringstream::~stringstream(local_340);
  std::ios_base::~ios_base(aiStack_2c0);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(aiStack_138);
  operator_delete(pfVar2,0x10);
  return bVar7;
}

Assistant:

bool TextureBorderClampParameterTextureBorderColor::verifyGLGetTexParameterfvResult(glw::GLenum			target,
																					const glw::GLfloat* expected_data)
{
	std::vector<glw::GLfloat> buffer(m_buffer_length);
	std::stringstream		  expectedDataStream;
	std::stringstream		  returnedDataStream;
	const glw::Functions&	 gl = m_context.getRenderContext().getFunctions();

	memset(&buffer[0], 0, m_buffer_length * sizeof(glw::GLfloat));

	gl.getTexParameterfv(target, m_glExtTokens.TEXTURE_BORDER_COLOR, &buffer[0]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Error getting parameter for texture.");

	for (glw::GLuint i = 0; i < m_buffer_length; ++i)
	{
		if (de::abs(expected_data[i] - buffer[i]) > TestCaseBase::m_epsilon_float)
		{
			for (glw::GLuint j = 0; j < m_buffer_length; ++j)
			{
				expectedDataStream << expected_data[j] << ",";
				returnedDataStream << buffer[j] << ",";
			}
			getTestContext().getLog()
				<< tcu::TestLog::Message
				<< "Wrong value encountered when calling glGetTexParameterfv() with GL_TEXTURE_BORDER_COLOR_EXT pname;"
				<< " texture target:" << getTexTargetString(target) << "\n"
				<< " expected values:[" << expectedDataStream.str() << "]"
				<< " result values:[" << returnedDataStream.str() << "]\n"
				<< tcu::TestLog::EndMessage;
			return false;
		}
	}
	return true;
}